

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_std::utf8_collator_from_wide::do_transform_abi_cxx11_
          (utf8_collator_from_wide *this,char *b,char *e)

{
  undefined4 uVar1;
  collate *pcVar2;
  ulong uVar3;
  undefined4 *puVar4;
  long in_RSI;
  string *in_RDI;
  uint32_t tv;
  uint i;
  wstring wkey;
  wstring tmp;
  string *key;
  undefined8 in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  string *this_00;
  char local_a4;
  char cStack_a3;
  char cStack_a2;
  uint local_a0;
  wstring local_98 [55];
  allocator local_61;
  string local_60 [32];
  wstring local_40 [64];
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"UTF-8",&local_61);
  conv::to_utf<wchar_t>
            ((char *)this_00,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             (method_type)((ulong)in_stack_ffffffffffffff10 >> 0x20));
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  pcVar2 = std::use_facet<std::__cxx11::collate<wchar_t>>((locale *)(in_RSI + 0x18));
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::c_str();
  std::__cxx11::wstring::size();
  std::__cxx11::collate<wchar_t>::transform((wchar_t *)local_98,(wchar_t *)pcVar2);
  std::__cxx11::string::string((string *)this_00);
  std::__cxx11::wstring::size();
  std::__cxx11::string::reserve((ulong)this_00);
  for (local_a0 = 0; uVar3 = std::__cxx11::wstring::size(), local_a0 < uVar3;
      local_a0 = local_a0 + 1) {
    puVar4 = (undefined4 *)std::__cxx11::wstring::operator[]((ulong)local_98);
    uVar1 = *puVar4;
    cStack_a2 = (char)((uint)uVar1 >> 0x10);
    std::__cxx11::string::operator+=((string *)this_00,cStack_a2);
    cStack_a3 = (char)((uint)uVar1 >> 8);
    std::__cxx11::string::operator+=((string *)this_00,cStack_a3);
    local_a4 = (char)uVar1;
    std::__cxx11::string::operator+=((string *)this_00,local_a4);
  }
  std::__cxx11::wstring::~wstring(local_98);
  std::__cxx11::wstring::~wstring(local_40);
  return in_RDI;
}

Assistant:

virtual std::string do_transform(char const *b,char const *e) const
    {
        std::wstring tmp=conv::to_utf<wchar_t>(b,e,"UTF-8");
        std::wstring wkey = 
            std::use_facet<wfacet>(base_).transform(tmp.c_str(),tmp.c_str()+tmp.size());
        std::string key;
        if(sizeof(wchar_t)==2)
            key.reserve(wkey.size()*2);
        else
            key.reserve(wkey.size()*3);
        for(unsigned i=0;i<wkey.size();i++) {
            if(sizeof(wchar_t)==2) {
                uint16_t tv = static_cast<uint16_t>(wkey[i]);
                key += char(tv >> 8);
                key += char(tv & 0xFF);
            }
            else { // 4
                uint32_t tv = static_cast<uint32_t>(wkey[i]);
                // 21 bit
                key += char((tv >> 16) & 0xFF);
                key += char((tv >> 8) & 0xFF);
                key += char(tv & 0xFF);
            }
        }
        return key;
    }